

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O2

size_t read_all(int fd,char *buffer,size_t buffer_size)

{
  ssize_t sVar1;
  char *__buf;
  char *pcVar2;
  
  __buf = extra_output_buffer;
  do {
    sVar1 = read(fd,__buf,(size_t)buffer);
    if (sVar1 < 1) break;
    __buf = __buf + sVar1;
    buffer = buffer + -sVar1;
  } while (buffer != (char *)0x0);
  pcVar2 = extra_output_buffer;
  if ((__buf != extra_output_buffer) && (pcVar2 = __buf, __buf[-1] == '\n')) {
    pcVar2 = __buf + -1;
    *pcVar2 = '\0';
  }
  return (size_t)(pcVar2 + -0x10a820);
}

Assistant:

static size_t read_all(int fd, char *buffer, size_t buffer_size) {
	ssize_t actually_read;
	char *buffer_start = buffer;
	do {
		actually_read = read(fd, buffer, buffer_size);
		if (actually_read > 0) {
			buffer += actually_read;
			buffer_size -= actually_read;
			if (buffer_size == 0) {
				break;
			}
		}
	} while (actually_read > 0);
	if (buffer_start != buffer) {
		if (*(buffer - 1) == 10) {
			*(buffer - 1) = 0;
			buffer--;
		}
	}
	return buffer - buffer_start;
}